

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array_stack.cpp
# Opt level: O0

void __thiscall ArrayStack_MaxSize_Test::TestBody(ArrayStack_MaxSize_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  size_t local_40;
  uint local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  array_stack<int,_2UL> stack;
  ArrayStack_MaxSize_Test *this_local;
  
  pstore::array_stack<int,_2UL>::array_stack((array_stack<int,_2UL> *)&gtest_ar.message_);
  local_34 = 2;
  local_40 = pstore::array_stack<int,_2UL>::max_size((array_stack<int,_2UL> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_30,"2U","stack.max_size ()",&local_34,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_array_stack.cpp"
               ,0x20,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST (ArrayStack, MaxSize) {
    pstore::array_stack<int, 2> stack;
    EXPECT_EQ (2U, stack.max_size ());
}